

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O1

void Centaurus::LDFARoutineEM64T<char>::emit_state
               (X86Assembler *as,Label *rejectlabel,LDFAState<char> *state,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *labels,
               vector<asmjit::Label,_std::allocator<asmjit::Label>_> *exitlabels)

{
  byte bVar1;
  uint uVar2;
  pointer pNVar3;
  pointer pRVar4;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> *pvVar5;
  Operand_ *o0;
  Range<char> *r;
  pointer pRVar6;
  NFATransition<char> *tr;
  pointer pNVar7;
  anon_union_16_7_ed616b9d_for_Operand__0 local_40;
  
  local_40._packed[0] = (UInt64)8.28907076174039e-317;
  local_40._any.reserved12_4 = 3;
  local_40._any.reserved8_4 = 0;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x1ad,(Operand_ *)(asmjit::x86OpData + 0x480),
             (Operand_ *)&local_40._any);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x490),
             (Operand_ *)(asmjit::x86OpData + 0x480));
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x105,(Operand_ *)(asmjit::x86OpData + 0x4b0));
  pNVar3 = (state->
           super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
           ).m_transitions.
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pNVar7 = (state->
                super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                ).m_transitions.
                super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pNVar7 != pNVar3; pNVar7 = pNVar7 + 1) {
    pRVar4 = (pNVar7->m_label).m_ranges.
             super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (pRVar6 = (pNVar7->m_label).m_ranges.
                  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pRVar6 != pRVar4; pRVar6 = pRVar6 + 1)
    {
      bVar1 = pRVar6->m_start;
      if (bVar1 + 1 == (uint)(byte)pRVar6->m_end) {
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),(uint)bVar1);
        uVar2 = pNVar7->m_dest;
        if ((long)(int)uVar2 < 0) {
          o0 = (Operand_ *)
               ((exitlabels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                _M_impl.super__Vector_impl_data._M_start + ~uVar2);
        }
        else {
          o0 = (Operand_ *)
               ((labels->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>)._M_impl.
                super__Vector_impl_data._M_start + (int)uVar2);
        }
        asmjit::CodeEmitter::emit((CodeEmitter *)as,0x118,o0);
      }
      else {
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x2c4,(Operand_ *)(asmjit::x86OpData + 0x480),(uint)bVar1);
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x67,(Operand_ *)(asmjit::x86OpData + 0x480),
                   (uint)(byte)pRVar6->m_end - (uint)(byte)pRVar6->m_start);
        uVar2 = pNVar7->m_dest;
        pvVar5 = labels;
        if ((int)uVar2 < 0) {
          pvVar5 = exitlabels;
        }
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x115,
                   (Operand_ *)
                   ((pvVar5->super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>).
                    _M_impl.super__Vector_impl_data._M_start + ((int)uVar2 >> 0x1f ^ uVar2)));
        asmjit::CodeEmitter::emit
                  ((CodeEmitter *)as,0x189,(Operand_ *)(asmjit::x86OpData + 0x480),
                   (Operand_ *)(asmjit::x86OpData + 0x490));
      }
    }
  }
  asmjit::CodeEmitter::emit((CodeEmitter *)as,0x11e,(Operand_ *)rejectlabel);
  return;
}

Assistant:

void LDFARoutineEM64T<TCHAR>::emit_state(asmjit::X86Assembler& as, asmjit::Label& rejectlabel, const LDFAState<TCHAR>& state, std::vector<asmjit::Label>& labels, std::vector<asmjit::Label>& exitlabels)
{
    if (sizeof(TCHAR) == 1)
        as.movzx(CHAR_REG, asmjit::x86::byte_ptr(PEEK_REG, 0));
    else
        as.movzx(CHAR_REG, asmjit::x86::word_ptr(PEEK_REG, 0));
    as.mov(CHAR2_REG, CHAR_REG);
    if (sizeof(TCHAR) == 1)
        as.inc(PEEK_REG);
    else
        as.add(PEEK_REG, 2);

    for (const auto& tr : state.get_transitions())
    {
        for (const auto& r : tr.label())
        {
            if (r.start() + 1 == r.end())
            {
                as.cmp(CHAR_REG, r.start());
                if (tr.dest() >= 0)
                {
                    as.je(labels[tr.dest()]);
                }
                else
                {
                    as.je(exitlabels[-tr.dest() - 1]);
                }
            }
            else
            {
                as.sub(CHAR_REG, r.start());
                as.cmp(CHAR_REG, r.end() - r.start());
                if (tr.dest() >= 0)
                {
                    as.jb(labels[tr.dest()]);
                }
                else
                {
                    as.jb(exitlabels[-tr.dest() - 1]);
                }
                as.mov(CHAR_REG, CHAR2_REG);
            }
        }
    }
    as.jmp(rejectlabel);
}